

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  socklen_t __len;
  sockaddr *__addr;
  char *pcVar5;
  double dVar6;
  allocator<char> local_696;
  allocator<char> local_695;
  allocator<char> local_694;
  allocator<char> local_693;
  allocator<char> local_692;
  allocator<char> local_691;
  string current_student;
  undefined8 local_66c;
  undefined4 local_664;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  db students;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590 [32];
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lan::db::db(&students);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"List",(allocator<char> *)&current_student);
  lan::db::declare(&students,&local_f0,Array);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Carlos",(allocator<char> *)&current_student);
  lan::db::declare(&students,&local_110,Array);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Anna",(allocator<char> *)&current_student);
  lan::db::declare(&students,&local_130,Array);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Antony",(allocator<char> *)&current_student);
  lan::db::declare(&students,&local_150,Array);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"List",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"Carlos",(allocator<char> *)&local_660);
  lan::db::iterate<std::__cxx11::string>(&students,&local_170,&local_190,String);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"List",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Anna",(allocator<char> *)&local_660);
  lan::db::iterate<std::__cxx11::string>(&students,&local_1b0,&local_1d0,String);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"List",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Antony",(allocator<char> *)&local_660);
  lan::db::iterate<std::__cxx11::string>(&students,&local_1f0,&local_210,String);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"Carlos",(allocator<char> *)&current_student);
  lan::db::iterate<int>(&students,&local_230,0,Container);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"Anna",(allocator<char> *)&current_student);
  lan::db::iterate<int>(&students,&local_250,0,Container);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Antony",(allocator<char> *)&current_student);
  lan::db::iterate<int>(&students,&local_270,0,Container);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"Carlos",(allocator<char> *)&current_student);
  lan::db::set_anchor(&students,&local_290,0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Full_name",(allocator<char> *)&local_660);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"Carlos Eduard",(allocator<char> *)&local_66c);
  lan::db::set<std::__cxx11::string>(&students,&local_2b0,&local_2d0,&local_2f0,String,true);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"Average",(allocator<char> *)&local_660);
  lan::db::set<double>(&students,&local_310,&local_330,13.0,Double,true);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"Passed",(allocator<char> *)&local_660);
  lan::db::set<bool>(&students,&local_350,&local_370,true,Bool,true);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"Anna",(allocator<char> *)&current_student);
  lan::db::set_anchor(&students,&local_390,0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Full_name",(allocator<char> *)&local_660);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Anna Cristin",(allocator<char> *)&local_66c);
  lan::db::set<std::__cxx11::string>(&students,&local_3b0,&local_3d0,&local_3f0,String,true);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"Average",(allocator<char> *)&local_660);
  lan::db::set<double>(&students,&local_410,&local_430,16.0,Double,true);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"Passed",(allocator<char> *)&local_660);
  lan::db::set<bool>(&students,&local_450,&local_470,true,Bool,true);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"Antony",(allocator<char> *)&current_student);
  lan::db::set_anchor(&students,&local_490,0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"Full_name",(allocator<char> *)&local_660);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"Antony Jeff",(allocator<char> *)&local_66c);
  lan::db::set<std::__cxx11::string>(&students,&local_4b0,&local_4d0,&local_4f0,String,true);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"Average",(allocator<char> *)&local_660);
  lan::db::set<double>(&students,&local_510,&local_530,9.0,Double,true);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"@",(allocator<char> *)&current_student);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"Passed",(allocator<char> *)&local_660);
  __len = 0;
  lan::db::set<bool>(&students,&local_550,&local_570,false,Bool,true);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::string<std::allocator<char>>
            (local_590,"generated_example.ldb",(allocator<char> *)&current_student);
  lan::db::connect(&students,(int)local_590,__addr,__len);
  std::__cxx11::string::~string(local_590);
  poVar3 = std::operator<<((ostream *)&std::cout,"Landia::db version: ");
  poVar3 = std::operator<<(poVar3,(string *)lan::db_version_abi_cxx11_);
  std::operator<<(poVar3,"; Hello world!\n");
  current_student._M_dataplus._M_p = (pointer)&current_student.field_2;
  current_student._M_string_length = 0;
  current_student.field_2._M_local_buf[0] = '\0';
  local_66c = 0x100000000;
  local_664 = 2;
  for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
    iVar1 = *(int *)((long)&local_66c + lVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"List",&local_696);
    lan::db::get<std::__cxx11::string>(&local_660,&students,&local_50,(long)iVar1,String);
    std::__cxx11::string::operator=((string *)&current_student,(string *)&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&current_student);
    lan::db::set_anchor(&students,&local_70,0);
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = std::operator<<((ostream *)&std::cout,"info: Printing description for student <");
    poVar3 = std::operator<<(poVar3,(string *)&current_student);
    poVar3 = std::operator<<(poVar3,">");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1 + 1);
    poVar3 = std::operator<<(poVar3,".\tName: ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"@",&local_696);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Full_name",&local_691);
    lan::db::get<std::__cxx11::string>(&local_660,&students,&local_5b0,&local_90,String);
    poVar3 = std::operator<<(poVar3,(string *)&local_660);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<(poVar3,"\tAverage : ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"@",&local_692);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Average",&local_693);
    dVar6 = lan::db::get<double>(&students,&local_5d0,&local_b0,Double);
    poVar3 = std::ostream::_M_insert<double>(dVar6);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"\tPassed : ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"@",&local_694);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Passed",&local_695);
    bVar2 = lan::db::get<bool>(&students,&local_5f0,&local_d0,Bool);
    pcVar5 = "No";
    if (bVar2) {
      pcVar5 = "Yes";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_5b0);
  }
  lan::db::push(&students);
  std::__cxx11::string::~string((string *)&current_student);
  lan::db::~db(&students);
  return 0;
}

Assistant:

int main (int argc, const char * argv []) {
    
    lan::db students;
    
    students.declare("List", lan::Array);
    students.declare("Carlos", lan::Array);
    students.declare("Anna", lan::Array);
    students.declare("Antony", lan::Array);
    
    students.iterate<std::string>("List", "Carlos", lan::String);
    students.iterate<std::string>("List", "Anna", lan::String);
    students.iterate<std::string>("List", "Antony", lan::String);
    
    students.iterate("Carlos", 0, lan::Container);
    students.iterate("Anna", 0, lan::Container);
    students.iterate("Antony", 0, lan::Container);
    
    students.set_anchor("Carlos", 0);
    
    students.set<std::string>("@", "Full_name", "Carlos Eduard" ,lan::String, true);
    students.set<double>("@", "Average", 13 ,lan::Double, true);
    students.set<bool>("@", "Passed", true ,lan::Bool, true);
    
    students.set_anchor("Anna", 0);
    
    students.set<std::string>("@", "Full_name", "Anna Cristin" ,lan::String, true);
    students.set<double>("@", "Average", 16 ,lan::Double, true);
    students.set<bool>("@", "Passed", true ,lan::Bool, true);
    
    students.set_anchor("Antony", 0);
    
    students.set<std::string>("@", "Full_name", "Antony Jeff" ,lan::String, true);
    students.set<double>("@", "Average", 9 ,lan::Double, true);
    students.set<bool>("@", "Passed", false ,lan::Bool, true);
    
    students.connect("generated_example.ldb");
        
    // students.print();
    
    std::cout << "Landia::db version: " << lan::db_version << "; Hello world!\n";
    
    std::string current_student;
    
    for( auto i : { 0, 1, 2}){
                current_student = students.get<std::string>("List", i, lan::String);
                students.set_anchor(current_student, 0);
                std::cout << "info: Printing description for student <" << current_student << ">"
                << std::endl
                << i + 1 <<".\tName: " << students.get<std::string>("@", "Full_name", lan::String) 
                << std::endl
                << "\tAverage : " <<  students.get<double>("@", "Average", lan::Double)
                << std::endl
                << "\tPassed : " <<  ((students.get<bool>("@", "Passed", lan::Bool) ? "Yes" : "No"))
                << std::endl;
        }
    
    students.push();
    
}